

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O3

unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>
s2textformat::MakePolygonOrDie(string_view str,S2Debug debug_override)

{
  bool bVar1;
  ostream *poVar2;
  undefined4 in_ECX;
  size_type sVar3;
  undefined7 in_register_00000011;
  unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_> *in_R9;
  string_view str_00;
  string_view piece;
  S2LogMessage SStack_28;
  
  piece.ptr_ = (char *)CONCAT71(in_register_00000011,debug_override);
  *(undefined8 *)str.ptr_ = 0;
  str_00.length_._0_4_ = in_ECX;
  str_00.ptr_ = piece.ptr_;
  str_00.length_._4_4_ = 0;
  bVar1 = InternalMakePolygon((s2textformat *)str.length_,str_00,DISABLE,str.ptr_._0_1_,in_R9);
  if (bVar1) {
    return (__uniq_ptr_data<S2Polygon,_std::default_delete<S2Polygon>,_true,_true>)
           (tuple<S2Polygon_*,_std::default_delete<S2Polygon>_>)str.ptr_;
  }
  sVar3 = 3;
  S2LogMessage::S2LogMessage
            (&SStack_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2text_format.cc"
             ,0xfa,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (SStack_28.stream_,"Check failed: MakePolygon(str, &polygon, debug_override) ",0x39);
  std::__ostream_insert<char,std::char_traits<char>>(SStack_28.stream_,": str == \"",10);
  piece.length_ = sVar3;
  poVar2 = absl::operator<<((absl *)SStack_28.stream_,(ostream *)str.length_,piece);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"",1);
  abort();
}

Assistant:

unique_ptr<S2Polygon> MakePolygonOrDie(string_view str,
                                       S2Debug debug_override) {
  unique_ptr<S2Polygon> polygon;
  S2_CHECK(MakePolygon(str, &polygon, debug_override))
      << ": str == \"" << str << "\"";
  return polygon;
}